

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cc
# Opt level: O2

statemachine_ctx *
ctemplate_htmlparser::statemachine_duplicate
          (statemachine_ctx *src,statemachine_definition *def,void *user)

{
  statemachine_ctx *__dest;
  
  if (src != (statemachine_ctx *)0x0) {
    __dest = statemachine_new(def,user);
    if (__dest != (statemachine_ctx *)0x0) {
      memcpy(__dest,src,0x180);
      __dest->definition = def;
      __dest->user = user;
    }
    return __dest;
  }
  __assert_fail("src != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/statemachine.cc"
                ,0x10a,
                "statemachine_ctx *ctemplate_htmlparser::statemachine_duplicate(statemachine_ctx *, statemachine_definition *, void *)"
               );
}

Assistant:

statemachine_ctx *statemachine_duplicate(statemachine_ctx *src,
                                         statemachine_definition *def,
                                         void *user)
{
    statemachine_ctx *dst;
    assert(src != NULL);
    dst = statemachine_new(def, user);
    if (dst == NULL)
      return NULL;

    statemachine_copy(dst, src, def, user);

    return dst;
}